

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5HeapArgumentsObject::GetItemAt
          (ES5HeapArgumentsObject *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyQueryFlags PVar2;
  ScriptContext *requestContext_00;
  
  requestContext_00 = requestContext;
  BVar1 = HeapArgumentsObject::IsArgumentDeleted(&this->super_HeapArgumentsObject,index);
  if (BVar1 != 0) {
    PVar2 = DynamicObject::GetItemQuery((DynamicObject *)this,this,index,value,requestContext);
    return (BOOL)(PVar2 == Property_Found);
  }
  BVar1 = HeapArgumentsObject::GetItemAt
                    (&this->super_HeapArgumentsObject,index,value,requestContext_00);
  return BVar1;
}

Assistant:

BOOL ES5HeapArgumentsObject::GetItemAt(uint32 index, Var* value, ScriptContext* requestContext)
    {
        return this->IsFormalDisconnectedFromNamedArgument(index) ?
            JavascriptConversion::PropertyQueryFlagsToBoolean(this->DynamicObject::GetItemQuery(this, index, value, requestContext)) :
            __super::GetItemAt(index, value, requestContext);
    }